

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwsq.c
# Opt level: O0

void hwsq_prep(disisa *isa)

{
  int iVar1;
  int f;
  int f_00;
  int iVar2;
  int v;
  int v_00;
  vardata *pvVar3;
  int v_g80;
  int v_nv41;
  int v_nv17;
  int vs_chipset;
  int f_nv41f;
  int f_nv17f;
  int f_nv41op;
  disisa *isa_local;
  
  pvVar3 = vardata_new("hwsq");
  isa->vardata = pvVar3;
  iVar1 = vardata_add_feature(isa->vardata,"nv41op","NV41+ features");
  f = vardata_add_feature(isa->vardata,"nv17f","NV17:G80 flags");
  f_00 = vardata_add_feature(isa->vardata,"nv41f","NV41:G80 flags");
  if (((iVar1 == -1) || (f == -1)) || (f_00 == -1)) {
    abort();
  }
  iVar2 = vardata_add_varset(isa->vardata,"chipset","GPU chipset");
  if (iVar2 == -1) {
    abort();
  }
  v = vardata_add_variant(isa->vardata,"nv17","NV17:NV41",iVar2);
  v_00 = vardata_add_variant(isa->vardata,"nv41","NV41:G80",iVar2);
  iVar2 = vardata_add_variant(isa->vardata,"g80","G80+",iVar2);
  if (((v != -1) && (v_00 != -1)) && (iVar2 != -1)) {
    vardata_variant_feature(isa->vardata,v,f);
    vardata_variant_feature(isa->vardata,v_00,f);
    vardata_variant_feature(isa->vardata,v_00,f_00);
    vardata_variant_feature(isa->vardata,v_00,iVar1);
    vardata_variant_feature(isa->vardata,iVar2,iVar1);
    iVar1 = vardata_validate(isa->vardata);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  abort();
}

Assistant:

static void hwsq_prep(struct disisa *isa) {
	isa->vardata = vardata_new("hwsq");
	int f_nv41op = vardata_add_feature(isa->vardata, "nv41op", "NV41+ features");
	int f_nv17f = vardata_add_feature(isa->vardata, "nv17f", "NV17:G80 flags");
	int f_nv41f = vardata_add_feature(isa->vardata, "nv41f", "NV41:G80 flags");
	if (f_nv41op == -1 || f_nv17f == -1 || f_nv41f == -1)
		abort();
	int vs_chipset = vardata_add_varset(isa->vardata, "chipset", "GPU chipset");
	if (vs_chipset == -1)
		abort();
	int v_nv17 = vardata_add_variant(isa->vardata, "nv17", "NV17:NV41", vs_chipset);
	int v_nv41 = vardata_add_variant(isa->vardata, "nv41", "NV41:G80", vs_chipset);
	int v_g80 = vardata_add_variant(isa->vardata, "g80", "G80+", vs_chipset);
	if (v_nv17 == -1 || v_nv41 == -1 || v_g80 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_nv17, f_nv17f);
	vardata_variant_feature(isa->vardata, v_nv41, f_nv17f);
	vardata_variant_feature(isa->vardata, v_nv41, f_nv41f);
	vardata_variant_feature(isa->vardata, v_nv41, f_nv41op);
	vardata_variant_feature(isa->vardata, v_g80, f_nv41op);
	if (vardata_validate(isa->vardata))
		abort();
}